

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O0

int __thiscall amrex::MultiCutFab::remove(MultiCutFab *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  MFIter mfi;
  MFIter *in_stack_ffffffffffffff78;
  uchar in_stack_ffffffffffffffa7;
  FabArrayBase *in_stack_ffffffffffffffa8;
  MFIter *in_stack_ffffffffffffffb0;
  MFIter *in_stack_ffffffffffffffc0;
  FabArray<amrex::CutFab> *in_stack_ffffffffffffffc8;
  
  MFIter::MFIter(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
  while (bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffff98), bVar1) {
    bVar1 = ok(this,in_stack_ffffffffffffff78);
    if ((!bVar1) &&
       (in_stack_ffffffffffffff78 =
             (MFIter *)
             FabArray<amrex::CutFab>::release(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
       in_stack_ffffffffffffff78 != (MFIter *)0x0)) {
      CutFab::~CutFab((CutFab *)0x117c31d);
      operator_delete(in_stack_ffffffffffffff78,0x48);
    }
    MFIter::operator++((MFIter *)&stack0xffffffffffffff98);
  }
  MFIter::~MFIter((MFIter *)this);
  return extraout_EAX;
}

Assistant:

void
MultiCutFab::remove ()
{
    for (MFIter mfi(m_data); mfi.isValid(); ++mfi)
    {
        if (!ok(mfi))
        {
            delete m_data.release(mfi);
        }
    }
}